

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O3

TrackData *
GenerateKBIWeakSectorTrack
          (TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track,int weak_offset,
          int weak_size)

{
  pointer pSVar1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  pointer puVar2;
  int iVar3;
  Data *data;
  Sector *pSVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  BitBuffer *bitstream;
  pointer this;
  TrackData *trackdata;
  Data dataW;
  size_t __len;
  BitstreamTrackBuilder bitbuf;
  FluxTrackBuilder fluxbuf;
  allocator_type local_14d;
  int local_14c;
  TrackData *local_148;
  void *local_140 [2];
  long local_130;
  long local_128;
  int local_11c;
  int local_118;
  int local_114;
  size_t local_110;
  Track *local_108;
  CylHead *local_100;
  BitstreamTrackBuilder local_f8;
  FluxTrackBuilder local_78;
  
  local_14c = weak_size;
  local_148 = __return_storage_ptr__;
  local_100 = cylhead;
  FluxTrackBuilder::FluxTrackBuilder(&local_78,cylhead,_250K,MFM);
  TrackBuilder::addTrackStart(&local_78.super_TrackBuilder,false);
  BitstreamTrackBuilder::BitstreamTrackBuilder(&local_f8,_250K,MFM);
  TrackBuilder::addTrackStart(&local_f8.super_TrackBuilder,false);
  iVar3 = Track::size(track);
  this = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
         super__Vector_impl_data._M_start;
  pSVar1 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_108 = track;
  if (this != pSVar1) {
    local_128 = (long)weak_offset;
    local_110 = (size_t)local_14c;
    local_11c = iVar3 + -1;
    local_118 = ((iVar3 - (local_11c >> 0x1f)) + -1 >> 1) + -1;
    do {
      data = Sector::data_copy(this,0);
      local_114 = (this->header).size;
      if (local_114 == 1) {
        TrackBuilder::addSectorUpToData(&local_78.super_TrackBuilder,&this->header,this->dam);
        __first._M_current =
             (data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_140,__first,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(__first._M_current + local_128),&local_14d);
        TrackBuilder::addBlock(&local_78.super_TrackBuilder,(Data *)local_140);
        if (local_140[0] != (void *)0x0) {
          operator_delete(local_140[0],local_130 - (long)local_140[0]);
        }
        FluxTrackBuilder::addWeakBlock(&local_78,local_14c);
        puVar2 = (data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar3 = Sector::size(this);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_140,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(puVar2 + local_110 + local_128),
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(puVar2 + iVar3),&local_14d);
        TrackBuilder::addBlock(&local_78.super_TrackBuilder,(Data *)local_140);
        if (local_140[0] != (void *)0x0) {
          operator_delete(local_140[0],local_130 - (long)local_140[0]);
        }
      }
      else {
        TrackBuilder::addSector
                  (&local_78.super_TrackBuilder,&this->header,data,0x54,this->dam,false);
      }
      TrackBuilder::addSector
                (&local_f8.super_TrackBuilder,&this->header,data,1,this->dam,local_114 == 1);
      pSVar4 = Track::operator[](local_108,local_118);
      if (this == pSVar4) {
        pSVar4 = Track::operator[](local_108,local_11c);
        __x = &Sector::data_copy(pSVar4,0)->
               super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_140,__x);
        if (local_14c != 0) {
          memset((void *)((long)local_140[0] + local_128),0xee,local_110);
        }
        TrackBuilder::addSector
                  (&local_f8.super_TrackBuilder,&pSVar4->header,(Data *)local_140,1,pSVar4->dam,true
                  );
        if (local_140[0] != (void *)0x0) {
          operator_delete(local_140[0],local_130 - (long)local_140[0]);
        }
      }
      this = this + 1;
    } while (this != pSVar1);
  }
  TrackData::TrackData(local_148,local_100);
  bitstream = BitstreamTrackBuilder::buffer(&local_f8);
  TrackData::add(local_148,bitstream);
  if (local_f8.m_buffer.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.m_buffer.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.m_buffer.m_sync_losses.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.m_buffer.m_sync_losses.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.m_buffer.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.m_buffer.m_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.m_buffer.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.m_buffer.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.m_flux_times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.m_flux_times.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.m_flux_times.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.m_flux_times.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_148;
}

Assistant:

TrackData GenerateKBIWeakSectorTrack(const CylHead& cylhead, const Track& track, int weak_offset, int weak_size)
{
#ifdef _DEBUG
    int temp_offset, temp_size;
    assert(IsKBIWeakSectorTrack(track, temp_offset, temp_size));
    assert(weak_offset == temp_offset && weak_size == temp_size);
#endif

    FluxTrackBuilder fluxbuf(cylhead, DataRate::_250K, Encoding::MFM);
    fluxbuf.addTrackStart();

    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addTrackStart();

    auto sectors = track.size();
    for (auto& sector : track)
    {
        auto& data_copy = sector.data_copy();
        auto is_weak = sector.header.size == 1;

        if (!is_weak)
            fluxbuf.addSector(sector.header, data_copy, 0x54, sector.dam);
        else
        {
            fluxbuf.addSectorUpToData(sector.header, sector.dam);
            fluxbuf.addBlock(Data(data_copy.begin(), data_copy.begin() + weak_offset));
            fluxbuf.addWeakBlock(weak_size);
            fluxbuf.addBlock(Data(
                data_copy.begin() + weak_offset + weak_size,
                data_copy.begin() + sector.size()));
        }

        bitbuf.addSector(sector.header, data_copy, 1, sector.dam, is_weak);

        // Insert the duplicate sector earlier on the track.
        if (&sector == &track[((sectors - 1) / 2) - 1])
        {
            auto& sectorW = track[sectors - 1];
            auto dataW{ sectorW.data_copy() };
            std::fill(dataW.begin() + weak_offset, dataW.begin() + weak_offset + weak_size, uint8_t(0xee));
            bitbuf.addSector(sectorW.header, dataW, 1, sectorW.dam, true);
        }
    }

    TrackData trackdata(cylhead);
    trackdata.add(std::move(bitbuf.buffer()));
    //trackdata.add(FluxData({ fluxbuf.buffer() }));
    return trackdata;
}